

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O3

void * prf_array_fit(void *id)

{
  uint uVar1;
  uint *puVar2;
  
  uVar1 = *(uint *)((long)id + -4);
  puVar2 = (uint *)realloc((void *)((long)id + -8),(ulong)((uVar1 & 0xf) * (uVar1 >> 4)) + 8);
  *puVar2 = uVar1 >> 4;
  puVar2[1] = uVar1;
  return puVar2 + 2;
}

Assistant:

void *
prf_array_fit(void *id)
{
  return prf_array_set_size(id, id_to_array(id)->numelem);
}